

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward_gelu_f32(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int *in_RDI;
  int i1;
  int ir1;
  int ir0;
  int dr;
  int nr;
  int nc;
  int nth;
  int ith;
  int local_3c;
  int local_38;
  int iVar4;
  int iVar5;
  int n;
  
  _Var1 = ggml_is_contiguous(in_RSI);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1471,
            "ggml_is_contiguous(src0)");
    abort();
  }
  _Var1 = ggml_is_contiguous(in_RDX);
  if (_Var1) {
    _Var1 = ggml_are_same_shape(in_RSI,in_RDX);
    if (_Var1) {
      if ((*in_RDI != 0) && (*in_RDI != 2)) {
        n = in_RDI[1];
        iVar3 = in_RDI[2];
        iVar5 = in_RSI->ne[0];
        iVar2 = ggml_nrows(in_RSI);
        iVar3 = (iVar2 + iVar3 + -1) / iVar3;
        local_38 = iVar3 * n;
        iVar4 = local_38;
        local_3c = iVar2;
        if (local_38 + iVar3 < iVar2) {
          local_3c = local_38 + iVar3;
        }
        for (; local_38 < local_3c; local_38 = local_38 + 1) {
          ggml_vec_gelu_f32(n,(float *)CONCAT44(iVar5,iVar2),(float *)CONCAT44(iVar3,iVar4));
        }
      }
      return;
    }
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1473,
            "ggml_are_same_shape(src0, dst)");
    abort();
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1472,
          "ggml_is_contiguous(dst)");
  abort();
}

Assistant:

static void ggml_compute_forward_gelu_f32(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    GGML_ASSERT(ggml_is_contiguous(src0));
    GGML_ASSERT(ggml_is_contiguous(dst));
    GGML_ASSERT(ggml_are_same_shape(src0, dst));

    if (params->type == GGML_TASK_INIT || params->type == GGML_TASK_FINALIZE) {
        return;
    }

    const int ith = params->ith;
    const int nth = params->nth;

    const int nc = src0->ne[0];
    const int nr = ggml_nrows(src0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    for (int i1 = ir0; i1 < ir1; i1++) {
        ggml_vec_gelu_f32(nc,
                (float *) ((char *) dst->data  + i1*( dst->nb[1])),
                (float *) ((char *) src0->data + i1*(src0->nb[1])));

#ifndef NDEBUG
        for (int k = 0; k < nc; k++) {
            const float x = ((float *) ((char *) dst->data + i1*( dst->nb[1])))[k];
            UNUSED(x);
            assert(!isnan(x));
            assert(!isinf(x));
        }
#endif
    }
}